

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_suffix.cc
# Opt level: O0

RegExp * re2c::emit(RangeSuffix *p,RegExp *re)

{
  MatchOp *this;
  Range *m;
  RegExp *pRVar1;
  RegExp *re1;
  RegExp *regexp;
  RegExp *re_local;
  RangeSuffix *p_local;
  
  p_local = (RangeSuffix *)re;
  if (p != (RangeSuffix *)0x0) {
    re1 = (RegExp *)0x0;
    for (re_local = (RegExp *)p; re_local != (RegExp *)0x0;
        re_local = (RegExp *)re_local[1]._vptr_RegExp) {
      this = (MatchOp *)operator_new(0x10);
      m = Range::ran(*(uint32_t *)&re_local->_vptr_RegExp,
                     *(int *)((long)&re_local->_vptr_RegExp + 4) + 1);
      MatchOp::MatchOp(this,m);
      pRVar1 = doCat((RegExp *)this,re);
      pRVar1 = emit((RangeSuffix *)re_local[2]._vptr_RegExp,pRVar1);
      re1 = doAlt(re1,pRVar1);
    }
    p_local = (RangeSuffix *)re1;
  }
  return (RegExp *)p_local;
}

Assistant:

RegExp * emit(RangeSuffix * p, RegExp * re)
{
	if (p == NULL)
		return re;
	else
	{
		RegExp * regexp = NULL;
		for (; p != NULL; p = p->next)
		{
			RegExp * re1 = doCat(new MatchOp(Range::ran (p->l, p->h + 1)), re);
			regexp = doAlt(regexp, emit(p->child, re1));
		}
		return regexp;
	}
}